

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O0

void __thiscall json_service::json_service(json_service *this,service *srv)

{
  ostream *poVar1;
  service *in_RSI;
  json_rpc_server *in_RDI;
  binder1<json_service,_json_service_*,_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_>
  *in_stack_fffffffffffff558;
  allocator *paVar2;
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
  *in_stack_fffffffffffff560;
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
  *this_00;
  allocator local_9e1;
  string local_9e0 [39];
  allocator local_9b9;
  string local_9b8 [32];
  code *local_998;
  undefined8 local_990;
  binder1<json_service,_json_service_*,_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_>
  local_988 [2];
  undefined1 local_949 [33];
  code *local_928;
  undefined8 local_920;
  string *in_stack_fffffffffffff6f0;
  method_type *in_stack_fffffffffffff6f8;
  json_service *in_stack_fffffffffffff700;
  allocator local_8d9;
  string local_8d8 [32];
  code *local_8b8;
  undefined8 local_8b0;
  binder1<json_service,_json_service_*,_cppcms::json::value> local_8a8 [2];
  allocator local_869;
  string local_868 [32];
  code *local_848;
  undefined8 local_840;
  binder1<json_service,_json_service_*,_std::vector<int,_std::allocator<int>_>_> local_838 [2];
  allocator local_7f9;
  string local_7f8 [32];
  code *local_7d8;
  undefined8 local_7d0;
  binder1<json_service,_json_service_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7c8 [2];
  allocator local_789;
  string local_788 [32];
  code *local_768;
  undefined8 local_760;
  binder1<json_service,_json_service_*,_int> local_758 [2];
  allocator local_719;
  string local_718 [32];
  code *local_6f8;
  undefined8 local_6f0;
  binder1<json_service,_json_service_*,_const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&>
  local_6e8 [2];
  allocator local_6a9;
  string local_6a8 [32];
  code *local_688;
  undefined8 local_680;
  binder1<json_service,_json_service_*,_const_std::map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>_&>
  local_678 [2];
  allocator local_639;
  string local_638 [32];
  code *local_618;
  undefined8 local_610;
  binder1<json_service,_json_service_*,_const_cppcms::json::value_&> local_608 [2];
  allocator local_5c9;
  string local_5c8 [32];
  code *local_5a8;
  undefined8 local_5a0;
  binder1<json_service,_json_service_*,_const_std::vector<int,_std::allocator<int>_>_&>
  local_598 [2];
  allocator local_559;
  string local_558 [32];
  code *local_538;
  undefined8 local_530;
  binder1<json_service,_json_service_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_528 [2];
  allocator local_4e9;
  string local_4e8 [32];
  code *local_4c8;
  undefined8 local_4c0;
  binder1<json_service,_json_service_*,_const_int_&> local_4b8 [2];
  allocator local_479;
  string local_478 [32];
  code *local_458;
  undefined8 local_450;
  binder1<json_service,_json_service_*,_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_>
  local_448 [2];
  allocator local_409;
  string local_408 [32];
  code *local_3e8;
  undefined8 local_3e0;
  binder1<json_service,_json_service_*,_std::map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>_>
  local_3d8 [2];
  allocator local_399;
  string local_398 [32];
  code *local_378;
  undefined8 local_370;
  binder1<json_service,_json_service_*,_cppcms::json::value> local_368 [2];
  allocator local_329;
  string local_328 [32];
  code *local_308;
  undefined8 local_300;
  binder1<json_service,_json_service_*,_std::vector<int,_std::allocator<int>_>_> local_2f8 [2];
  allocator local_2b9;
  string local_2b8 [32];
  code *local_298;
  undefined8 local_290;
  binder1<json_service,_json_service_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288 [2];
  allocator local_249;
  string local_248 [32];
  code *local_228;
  undefined8 local_220;
  binder1<json_service,_json_service_*,_int> local_218 [2];
  code *local_1e0;
  undefined8 local_1d8;
  binder1<json_service,_json_service_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  undefined1 local_1b8 [39];
  allocator local_191;
  string local_190 [32];
  code *local_170;
  undefined8 local_168;
  binder2<json_service,_json_service_*,_int,_int> local_160;
  undefined1 local_148 [39];
  allocator local_121;
  string local_120 [32];
  code *local_100;
  undefined8 local_f8;
  binder2<json_service,_json_service_*,_int,_int> local_f0;
  undefined1 local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  code *local_90;
  undefined8 local_88;
  binder2<json_service,_json_service_*,_int,_int> local_80;
  undefined1 local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  cppcms::rpc::json_rpc_server::json_rpc_server(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR__json_service_00132a30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"sum",&local_31);
  local_90 = sum;
  local_88 = 0;
  cppcms::rpc::json_method<json_service,json_service*,int,int>
            (&local_80,(rpc *)sum,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder2<json_service,json_service*,int,int>,void>
            (in_stack_fffffffffffff560,
             (binder2<json_service,_json_service_*,_int,_int> *)in_stack_fffffffffffff558);
  cppcms::rpc::json_rpc_server::bind(in_RDI,local_30,local_68,1);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11c023);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"div",&local_b1);
  local_100 = div;
  local_f8 = 0;
  cppcms::rpc::json_method<json_service,json_service*,int,int>
            (&local_f0,(rpc *)div,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder2<json_service,json_service*,int,int>,void>
            (in_stack_fffffffffffff560,
             (binder2<json_service,_json_service_*,_int,_int> *)in_stack_fffffffffffff558);
  cppcms::rpc::json_rpc_server::bind(in_RDI,local_b0,local_d8,1);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11c0fa);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"notify",&local_121);
  local_170 = div;
  local_168 = 0;
  cppcms::rpc::json_method<json_service,json_service*,int,int>
            (&local_160,(rpc *)div,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder2<json_service,json_service*,int,int>,void>
            (in_stack_fffffffffffff560,
             (binder2<json_service,_json_service_*,_int,_int> *)in_stack_fffffffffffff558);
  cppcms::rpc::json_rpc_server::bind(in_RDI,local_120,local_148,2);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11c1d1);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"both",&local_191);
  local_1e0 = both;
  local_1d8 = 0;
  cppcms::rpc::json_method<json_service,json_service*,std::__cxx11::string>
            (&local_1d0,(rpc *)both,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::__cxx11::string>,void>
            (in_stack_fffffffffffff560,
             (binder1<json_service,_json_service_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffff558);
  cppcms::rpc::json_rpc_server::bind(in_RDI,local_190,local_1b8,0);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11c2a5);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  poVar1 = std::operator<<((ostream *)&std::cout,"Checking bindings");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_228 = compiles1c;
  local_220 = 0;
  cppcms::rpc::json_method<json_service,json_service*,int>
            (local_218,(rpc *)compiles1c,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,int>,void>
            (in_stack_fffffffffffff560,
             (binder1<json_service,_json_service_*,_int> *)in_stack_fffffffffffff558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"[10]",&local_249);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11c3c4);
  local_298 = compiles2c;
  local_290 = 0;
  cppcms::rpc::json_method<json_service,json_service*,std::__cxx11::string>
            (local_288,(rpc *)compiles2c,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::__cxx11::string>,void>
            (in_stack_fffffffffffff560,
             (binder1<json_service,_json_service_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffff558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"[\"str\"]",&local_2b9);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11c496);
  local_308 = compiles3c;
  local_300 = 0;
  cppcms::rpc::json_method<json_service,json_service*,std::vector<int,std::allocator<int>>>
            (local_2f8,(rpc *)compiles3c,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::vector<int,std::allocator<int>>>,void>
            (in_stack_fffffffffffff560,
             (binder1<json_service,_json_service_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffff558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"[[1,2]]",&local_329);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11c568);
  local_378 = compiles4c;
  local_370 = 0;
  cppcms::rpc::json_method<json_service,json_service*,cppcms::json::value>
            (local_368,(rpc *)compiles4c,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,cppcms::json::value>,void>
            (in_stack_fffffffffffff560,
             (binder1<json_service,_json_service_*,_cppcms::json::value> *)in_stack_fffffffffffff558
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"[{}]",&local_399);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11c63a);
  local_3e8 = compiles5c;
  local_3e0 = 0;
  cppcms::rpc::
  json_method<json_service,json_service*,std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
            (local_3d8,(rpc *)compiles5c,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>,void>
            (in_stack_fffffffffffff560,
             (binder1<json_service,_json_service_*,_std::map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>_>
              *)in_stack_fffffffffffff558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"[{\"member\":1}]",&local_409);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11c706);
  local_458 = compiles6c;
  local_450 = 0;
  cppcms::rpc::
  json_method<json_service,json_service*,std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>>
            (local_448,(rpc *)compiles6c,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>>,void>
            (in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"[[1]]",&local_479);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11c7d2);
  local_4c8 = compiles1cr;
  local_4c0 = 0;
  cppcms::rpc::json_method<json_service,json_service*,int_const&>
            (local_4b8,(rpc *)compiles1cr,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,int_const&>,void>
            (in_stack_fffffffffffff560,
             (binder1<json_service,_json_service_*,_const_int_&> *)in_stack_fffffffffffff558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e8,"[10]",&local_4e9);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11c89e);
  local_538 = compiles2cr;
  local_530 = 0;
  cppcms::rpc::json_method<json_service,json_service*,std::__cxx11::string_const&>
            (local_528,(rpc *)compiles2cr,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::__cxx11::string_const&>,void>
            (in_stack_fffffffffffff560,
             (binder1<json_service,_json_service_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)in_stack_fffffffffffff558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_558,"[\"str\"]",&local_559);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_558);
  std::allocator<char>::~allocator((allocator<char> *)&local_559);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11c96a);
  local_5a8 = compiles3cr;
  local_5a0 = 0;
  cppcms::rpc::json_method<json_service,json_service*,std::vector<int,std::allocator<int>>const&>
            (local_598,(rpc *)compiles3cr,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::vector<int,std::allocator<int>>const&>,void>
            (in_stack_fffffffffffff560,
             (binder1<json_service,_json_service_*,_const_std::vector<int,_std::allocator<int>_>_&>
              *)in_stack_fffffffffffff558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c8,"[[1,2]]",&local_5c9);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11ca36);
  local_618 = compiles4cr;
  local_610 = 0;
  cppcms::rpc::json_method<json_service,json_service*,cppcms::json::value_const&>
            (local_608,(rpc *)compiles4cr,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,cppcms::json::value_const&>,void>
            (in_stack_fffffffffffff560,
             (binder1<json_service,_json_service_*,_const_cppcms::json::value_&> *)
             in_stack_fffffffffffff558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_638,"[{}]",&local_639);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator((allocator<char> *)&local_639);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11cb02);
  local_688 = compiles5cr;
  local_680 = 0;
  cppcms::rpc::
  json_method<json_service,json_service*,std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>const&>
            (local_678,(rpc *)compiles5cr,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>const&>,void>
            (in_stack_fffffffffffff560,
             (binder1<json_service,_json_service_*,_const_std::map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>_&>
              *)in_stack_fffffffffffff558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a8,"[{\"member\":1}]",&local_6a9);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11cbce);
  local_6f8 = compiles6cr;
  local_6f0 = 0;
  cppcms::rpc::
  json_method<json_service,json_service*,std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&>
            (local_6e8,(rpc *)compiles6cr,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&>,void>
            (in_stack_fffffffffffff560,
             (binder1<json_service,_json_service_*,_const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&>
              *)in_stack_fffffffffffff558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_718,"[[1]]",&local_719);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11cc9a);
  local_768 = compiles1v;
  local_760 = 0;
  cppcms::rpc::json_method<json_service,json_service*,int>
            (local_758,(rpc *)compiles1v,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,int>,void>
            (in_stack_fffffffffffff560,
             (binder1<json_service,_json_service_*,_int> *)in_stack_fffffffffffff558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_788,"[10]",&local_789);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_788);
  std::allocator<char>::~allocator((allocator<char> *)&local_789);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11cd66);
  local_7d8 = compiles2v;
  local_7d0 = 0;
  cppcms::rpc::json_method<json_service,json_service*,std::__cxx11::string>
            (local_7c8,(rpc *)compiles2v,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::__cxx11::string>,void>
            (in_stack_fffffffffffff560,
             (binder1<json_service,_json_service_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffff558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f8,"[\"str\"]",&local_7f9);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11ce32);
  local_848 = compiles3v;
  local_840 = 0;
  cppcms::rpc::json_method<json_service,json_service*,std::vector<int,std::allocator<int>>>
            (local_838,(rpc *)compiles3v,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::vector<int,std::allocator<int>>>,void>
            (in_stack_fffffffffffff560,
             (binder1<json_service,_json_service_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffff558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_868,"[[1,2]]",&local_869);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_868);
  std::allocator<char>::~allocator((allocator<char> *)&local_869);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11cefe);
  local_8b8 = compiles4v;
  local_8b0 = 0;
  cppcms::rpc::json_method<json_service,json_service*,cppcms::json::value>
            (local_8a8,(rpc *)compiles4v,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,cppcms::json::value>,void>
            (in_stack_fffffffffffff560,
             (binder1<json_service,_json_service_*,_cppcms::json::value> *)in_stack_fffffffffffff558
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8d8,"[{}]",&local_8d9);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11cfca);
  local_928 = compiles5v;
  local_920 = 0;
  cppcms::rpc::
  json_method<json_service,json_service*,std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
            ((binder1<json_service,_json_service_*,_std::map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>_>
              *)&stack0xfffffffffffff6e8,(rpc *)compiles5v,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>,void>
            (in_stack_fffffffffffff560,
             (binder1<json_service,_json_service_*,_std::map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>_>
              *)in_stack_fffffffffffff558);
  this_00 = (function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)local_949;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_949 + 1),"[{\"member\":1}]",(allocator *)this_00);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string((string *)(local_949 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_949);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11d096);
  local_998 = compiles6v;
  local_990 = 0;
  cppcms::rpc::
  json_method<json_service,json_service*,std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>>
            (local_988,(rpc *)compiles6v,0,(json_service *)in_RDI);
  std::function<void(std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>const&)>::
  function<cppcms::rpc::details::binder1<json_service,json_service*,std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>>,void>
            (this_00,in_stack_fffffffffffff558);
  paVar2 = &local_9b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9b8,"[[1]]",paVar2);
  check_method(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_9b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  ~function((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
             *)0x11d162);
  poVar1 = std::operator<<((ostream *)&std::cout,"Ok");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e0,"{}",&local_9e1);
  cppcms::rpc::json_rpc_server::smd_raw((string *)in_RDI);
  std::__cxx11::string::~string(local_9e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
  return;
}

Assistant:

json_service(cppcms::service &srv) : cppcms::rpc::json_rpc_server(srv)
	{
		bind("sum",cppcms::rpc::json_method(&json_service::sum,this),method_role);
		bind("div",cppcms::rpc::json_method(&json_service::div,this),method_role);
		bind("notify",cppcms::rpc::json_method(&json_service::div,this),notification_role);
		bind("both",cppcms::rpc::json_method(&json_service::both,this));

		std::cout << "Checking bindings" << std::endl;
		check_method(cppcms::rpc::json_method(&json_service::compiles1c,this),"[10]");
		check_method(cppcms::rpc::json_method(&json_service::compiles2c,this),"[\"str\"]");
		check_method(cppcms::rpc::json_method(&json_service::compiles3c,this),"[[1,2]]");
		check_method(cppcms::rpc::json_method(&json_service::compiles4c,this),"[{}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles5c,this),"[{\"member\":1}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles6c,this),"[[1]]");
		
		check_method(cppcms::rpc::json_method(&json_service::compiles1cr,this),"[10]");
		check_method(cppcms::rpc::json_method(&json_service::compiles2cr,this),"[\"str\"]");
		check_method(cppcms::rpc::json_method(&json_service::compiles3cr,this),"[[1,2]]");
		check_method(cppcms::rpc::json_method(&json_service::compiles4cr,this),"[{}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles5cr,this),"[{\"member\":1}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles6cr,this),"[[1]]");

		check_method(cppcms::rpc::json_method(&json_service::compiles1v,this),"[10]");
		check_method(cppcms::rpc::json_method(&json_service::compiles2v,this),"[\"str\"]");
		check_method(cppcms::rpc::json_method(&json_service::compiles3v,this),"[[1,2]]");
		check_method(cppcms::rpc::json_method(&json_service::compiles4v,this),"[{}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles5v,this),"[{\"member\":1}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles6v,this),"[[1]]");

		std::cout << "Ok" << std::endl;

		smd_raw("{}");
	}